

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ushort *puVar3;
  TcParseTableBase *pTVar4;
  ulong uVar5;
  Nonnull<const_char_*> pcVar6;
  ParseContext ctx;
  ZeroCopyCodedInputStream zcis;
  ushort *local_c0 [2];
  ushort *local_b0;
  char *local_a8;
  TcParseTableBase *in_stack_ffffffffffffff60;
  int local_94;
  MessageLite *msg;
  ZeroCopyInputStream local_40;
  CodedInputStream *local_38;
  
  local_40._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_00462978;
  msg = (MessageLite *)0x0;
  local_38 = input;
  puVar3 = (ushort *)
           internal::EpsCopyInputStream::InitFrom((EpsCopyInputStream *)&local_b0,&local_40);
  pTVar4 = GetTcParseTable(this);
  local_c0[0] = puVar3;
  do {
    bVar1 = internal::EpsCopyInputStream::DoneWithCheck<false>
                      ((EpsCopyInputStream *)&local_b0,(char **)local_c0,0);
    if (bVar1) break;
    uVar2 = (uint)pTVar4->fast_idx_mask & (uint)*local_c0[0];
    if ((uVar2 & 7) != 0) {
      internal::protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar5 = (ulong)(uVar2 & 0xfffffff8);
    local_c0[0] = (ushort *)
                  (**(code **)(&pTVar4[1].has_bits_offset + uVar5))
                            (this,local_c0[0],(EpsCopyInputStream *)&local_b0,
                             (ulong)*local_c0[0] ^ *(ulong *)(&pTVar4[1].fast_idx_mask + uVar5 * 2),
                             pTVar4,0);
  } while (local_c0[0] != (ushort *)0x0);
  if ((pTVar4->field_0x9 & 1) == 0) {
    puVar3 = local_c0[0];
    if (local_c0[0] == (ushort *)0x0) {
      internal::TcParser::VerifyHasBitConsistency(msg,in_stack_ffffffffffffff60);
      puVar3 = local_c0[0];
    }
  }
  else {
    puVar3 = (ushort *)
             (*pTVar4->post_loop_handler)(this,(char *)local_c0[0],(ParseContext *)&local_b0);
  }
  if (puVar3 != (ushort *)0x0) {
    internal::EpsCopyInputStream::BackUp((EpsCopyInputStream *)&local_b0,(char *)puVar3);
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (1,1,"ctx.LastTag() != 1u");
    if (pcVar6 != (Nonnull<const_char_*>)0x0) {
      MergeFromImpl();
    }
    if ((puVar3 <= local_b0) ||
       ((in_stack_ffffffffffffff60 != (TcParseTableBase *)0x0 &&
        ((long)puVar3 - (long)local_a8 <= (long)local_94)))) {
      input->last_tag_ = 1;
      if ((parse_flags & kMergePartial) == kMerge) {
        bVar1 = IsInitializedWithErrors(this);
        return bVar1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = internal::TcParser::ParseLoop(this, ptr, &ctx, GetTcParseTable());
  if (ABSL_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    ABSL_DCHECK_NE(ctx.LastTag(), 1u);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}